

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::register_handler
          (Reactor<iqnet::Null_lock> *this,Event_handler *eh,Event_mask mask)

{
  Event_mask EVar1;
  mapped_type pEVar2;
  bool bVar3;
  uint uVar4;
  mapped_type *ppEVar5;
  pointer pHVar6;
  _List_iterator<iqnet::Reactor_base::HandlerState> local_50;
  hs_iterator i;
  _Self local_40;
  _Self local_38;
  int local_30 [2];
  Handler fd;
  scoped_lock local_1d;
  Event_mask local_1c;
  scoped_lock lk;
  Event_handler *pEStack_18;
  Event_mask mask_local;
  Event_handler *eh_local;
  Reactor<iqnet::Null_lock> *this_local;
  
  local_1c = mask;
  pEStack_18 = eh;
  Null_lock::scoped_lock::scoped_lock(&local_1d,(Null_lock *)&this->field_0x8);
  uVar4 = (*pEStack_18->_vptr_Event_handler[2])();
  if ((uVar4 & 1) != 0) {
    this->num_stoppers = this->num_stoppers + 1;
  }
  local_30[0] = (*pEStack_18->_vptr_Event_handler[9])();
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
       ::find(&this->handlers,local_30);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
       ::end(&this->handlers);
  bVar3 = std::operator==(&local_38,&local_40);
  if (bVar3) {
    Reactor_base::HandlerState::HandlerState((HandlerState *)&i,local_30[0],local_1c);
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    push_back(&this->handlers_states,(value_type *)&i);
    pEVar2 = pEStack_18;
    ppEVar5 = std::
              map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
              ::operator[](&this->handlers,local_30);
    *ppEVar5 = pEVar2;
  }
  else {
    local_50._M_node = (_List_node_base *)find_handler_state(this,pEStack_18);
    EVar1 = local_1c;
    pHVar6 = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_50);
    pHVar6->mask = pHVar6->mask | (ushort)EVar1;
  }
  Null_lock::scoped_lock::~scoped_lock(&local_1d);
  return;
}

Assistant:

void Reactor<Lock>::register_handler( Event_handler* eh, Event_mask mask )
{
  scoped_lock lk(lock);

  if (eh->is_stopper())
    num_stoppers++;

  Socket::Handler fd = eh->get_handler();

  if( handlers.find(fd) == handlers.end() )
  {
    handlers_states.push_back( HandlerState(fd, mask) );
    handlers[fd] = eh;
  }
  else
  {
    typename Reactor<Lock>::hs_iterator i = find_handler_state(eh);
    i->mask |= mask;
  }
}